

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O1

void __thiscall QLineEdit::dropEvent(QLineEdit *this,QDropEvent *e)

{
  QLineEditPrivate *this_00;
  QWidgetLineControl *this_01;
  int pos;
  QLineEdit *pQVar1;
  int start;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  double dVar4;
  double dVar5;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QMimeData::text();
  if ((local_58.d.ptr == (char16_t *)0x0) || ((this_00->control->field_0x50 & 4) != 0)) {
    e[0xc] = (QDropEvent)0x0;
    QWidget::update(&this->super_QWidget);
  }
  else {
    pQVar1 = (QLineEdit *)QDropEvent::source();
    if ((pQVar1 == this) && (*(int *)(e + 0x2c) == 1)) {
      QWidgetLineControl::deselect
                (*(QWidgetLineControl **)(*(long *)&(this->super_QWidget).field_0x8 + 600));
    }
    dVar5 = (double)((ulong)*(double *)(e + 0x10) & 0x8000000000000000 | (ulong)DAT_0066f5c0) +
            *(double *)(e + 0x10);
    dVar4 = 2147483647.0;
    if (dVar5 <= 2147483647.0) {
      dVar4 = dVar5;
    }
    if (dVar4 <= -2147483648.0) {
      dVar4 = -2147483648.0;
    }
    pos = QLineEditPrivate::xToPos(this_00,(int)dVar4,CursorBetweenCharacters);
    this_01 = this_00->control;
    iVar2 = this_01->m_selstart;
    iVar3 = this_01->m_selend;
    if ((this_01->m_text).d.size == 0 || iVar3 <= iVar2) {
      iVar2 = -1;
      iVar3 = -1;
    }
    QWidgetLineControl::moveCursor((QWidgetLineControl *)this_01,pos,false);
    this_00->field_0x27c = this_00->field_0x27c & 0xfb;
    *(undefined4 *)(e + 0x2c) = *(undefined4 *)(e + 0x30);
    e[0xc] = (QDropEvent)0x1;
    QWidgetLineControl::insert
              (*(QWidgetLineControl **)(*(long *)&(this->super_QWidget).field_0x8 + 600),&local_58);
    pQVar1 = (QLineEdit *)QDropEvent::source();
    if (pQVar1 == this) {
      start = pos;
      if ((*(int *)(e + 0x2c) == 2) &&
         (((pos <= iVar2 || (start = iVar2, iVar3 < pos)) && (start = pos, iVar3 < pos)))) {
        start = pos - (int)local_58.d.size;
      }
      setSelection(this,start,(int)local_58.d.size);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEdit::dropEvent(QDropEvent* e)
{
    Q_D(QLineEdit);
    QString str = e->mimeData()->text();

    if (!str.isNull() && !d->control->isReadOnly()) {
        if (e->source() == this && e->dropAction() == Qt::CopyAction)
            deselect();
        int cursorPos = d->xToPos(e->position().toPoint().x());
        int selStart = cursorPos;
        int oldSelStart = d->control->selectionStart();
        int oldSelEnd = d->control->selectionEnd();
        d->control->moveCursor(cursorPos, false);
        d->cursorVisible = false;
        e->acceptProposedAction();
        insert(str);
        if (e->source() == this) {
            if (e->dropAction() == Qt::MoveAction) {
                if (selStart > oldSelStart && selStart <= oldSelEnd)
                    setSelection(oldSelStart, str.size());
                else if (selStart > oldSelEnd)
                    setSelection(selStart - str.size(), str.size());
                else
                    setSelection(selStart, str.size());
            } else {
                setSelection(selStart, str.size());
            }
        }
    } else {
        e->ignore();
        update();
    }
}